

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncTee::pumpTo
          (AsyncTee *this,Branch *branch,AsyncOutputStream *output,uint64_t amount)

{
  bool bVar1;
  OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception> *this_00;
  Exception *t;
  Promise<unsigned_long> *pPVar2;
  undefined8 in_R8;
  undefined1 local_220 [8];
  ReducePromises<unsigned_long> promise;
  OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception> *reason;
  OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception> *_reason1891;
  Fault local_68;
  Fault f;
  undefined1 local_58 [8];
  DebugComparison<kj::Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&>_&,_const_kj::None_&>
  _kjCondition;
  uint64_t amount_local;
  AsyncOutputStream *output_local;
  Branch *branch_local;
  AsyncTee *this_local;
  
  _kjCondition._32_8_ = in_R8;
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&> *)(output + 0xf));
  kj::_::DebugExpression<kj::Maybe<kj::(anonymous_namespace)::AsyncTee::Sink&>&>::operator==
            ((DebugComparison<kj::Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&>_&,_const_kj::None_&>
              *)local_58,
             (DebugExpression<kj::Maybe<kj::(anonymous_namespace)::AsyncTee::Sink&>&> *)&f,
             (None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
  if (bVar1) {
    if (_kjCondition._32_8_ == 0) {
      Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,0);
    }
    else {
      bVar1 = Buffer::empty((Buffer *)(output + 5));
      if ((bVar1) &&
         (this_00 = kj::_::
                    readMaybe<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,kj::Exception>>
                              ((Maybe<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception>_>
                                *)&(branch->buffer).bufferList.
                                   super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
                                   ._M_impl.super__Deque_impl_data._M_start._M_node),
         this_00 != (OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception> *)0x0)) {
        bVar1 = OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception>::
                is<kj::(anonymous_namespace)::AsyncTee::Eof>(this_00);
        if (bVar1) {
          constPromise<unsigned_long,_0UL>();
        }
        else {
          t = OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception>::get<kj::Exception>
                        (this_00);
          cp<kj::Exception>((Exception *)&promise,t);
          Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,(Exception *)&promise);
          Exception::~Exception((Exception *)&promise);
        }
      }
      else {
        newAdaptedPromise<unsigned_long,kj::(anonymous_namespace)::AsyncTee::PumpSink,kj::Maybe<kj::(anonymous_namespace)::AsyncTee::Sink&>&,kj::AsyncOutputStream&,unsigned_long&>
                  ((kj *)local_220,
                   (Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&> *)(output + 0xf),
                   (AsyncOutputStream *)amount,(unsigned_long *)&_kjCondition.result);
        ensurePulling((AsyncTee *)branch);
        pPVar2 = mv<kj::Promise<unsigned_long>>((Promise<unsigned_long> *)local_220);
        Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,pPVar2);
        Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)local_220);
      }
    }
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::(anonymous_namespace)::AsyncTee::Sink&>&,kj::None_const&>&>
            (&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x75c,FAILED,"branch.sink == kj::none","_kjCondition,",
             (DebugComparison<kj::Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&>_&,_const_kj::None_&>
              *)local_58);
  kj::_::Debug::Fault::fatal(&local_68);
}

Assistant:

Promise<uint64_t> pumpTo(Branch& branch, AsyncOutputStream& output, uint64_t amount)  {
    KJ_ASSERT(branch.sink == kj::none);

    if (amount == 0) {
      return amount;
    }

    if (branch.buffer.empty()) {
      KJ_IF_SOME(reason, stoppage) {
        if (reason.is<Eof>()) {
          return constPromise<uint64_t, 0>();
        }
        return cp(reason.get<Exception>());
      }
    }

    auto promise = newAdaptedPromise<uint64_t, PumpSink>(branch.sink, output, amount);
    ensurePulling();
    return mv(promise);
  }